

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_sign(uint8_t *private_key,uint8_t *message_hash,uint hash_size,uint8_t *signature,
             uECC_Curve curve)

{
  int iVar1;
  long lVar2;
  uECC_word_t k [4];
  
  lVar2 = 0x41;
  while( true ) {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      return 0;
    }
    iVar1 = uECC_generate_random_int(k,curve->n,(wordcount_t)((curve->num_n_bits + 0x3f) / 0x40));
    if (iVar1 == 0) break;
    iVar1 = uECC_sign_with_k(private_key,message_hash,hash_size,k,signature,curve);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int uECC_sign(const uint8_t *private_key,
              const uint8_t *message_hash,
              unsigned hash_size,
              uint8_t *signature,
              uECC_Curve curve) {
    uECC_word_t k[uECC_MAX_WORDS];
    uECC_word_t tries;

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!uECC_generate_random_int(k, curve->n, BITS_TO_WORDS(curve->num_n_bits))) {
            return 0;
        }

        if (uECC_sign_with_k(private_key, message_hash, hash_size, k, signature, curve)) {
            return 1;
        }
    }
    return 0;
}